

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inifile.cpp
# Opt level: O2

bool __thiscall utils::IniFile::readFile(IniFile *this,string *filename)

{
  char cVar1;
  istream *piVar2;
  long lVar3;
  string *psVar4;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar5;
  DebugStream *pDVar6;
  uint64_t output;
  string *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  bool bVar7;
  allocator local_441;
  string line;
  string name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_3d8;
  string value;
  string local_3b0;
  string group;
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310;
  string local_2f0 [32];
  wordexp_t exp_res;
  string local_2b8 [32];
  string local_298;
  string local_278;
  string local_258;
  ifstream file;
  
  local_3d8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this;
  std::ifstream::ifstream(&file);
  wordexp((filename->_M_dataplus)._M_p,(wordexp_t *)&exp_res,0);
  std::ifstream::open((char *)&file,(_Ios_Openmode)*exp_res.we_wordv);
  wordfree((wordexp_t *)&exp_res);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::string::string(local_2f0,"inifile",(allocator *)&group);
    debug(&line);
    pDVar6 = DebugStream::operator<<((DebugStream *)&line,"unable to open file");
    std::__cxx11::string::string((string *)&local_310,(string *)filename);
    DebugStream::operator<<(pDVar6,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    DebugStream::~DebugStream((DebugStream *)&line);
    std::__cxx11::string::~string(local_2f0);
    bVar7 = true;
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    output = 0;
    line.field_2._M_local_buf[0] = '\0';
    group._M_dataplus._M_p = (pointer)&group.field_2;
    group._M_string_length = 0;
    group.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line);
      bVar7 = ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0;
      if (bVar7) break;
      lVar3 = std::__cxx11::string::find((char *)&line,0x1186d9);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&line);
        trim(&name,&local_258);
        std::__cxx11::string::operator=((string *)&line,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&local_258);
      }
      output = output + 1;
      if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
        if (*line._M_dataplus._M_p == '[') {
          lVar3 = std::__cxx11::string::find((char)&line,0x5d);
          if (lVar3 == -1) {
            std::__cxx11::string::string(local_330,"inifile",(allocator *)&value);
            debug(&name);
            pDVar6 = DebugStream::operator<<
                               ((DebugStream *)&name,"invalid file, unclosed group at line ");
            DebugStream::operator<<(pDVar6,output);
            DebugStream::~DebugStream((DebugStream *)&name);
            psVar4 = local_330;
LAB_00115e49:
            std::__cxx11::string::~string(psVar4);
            break;
          }
          __return_storage_ptr__ = &local_278;
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&line);
          __return_storage_ptr___00 = &name;
          trim(__return_storage_ptr___00,__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)&group,(string *)__return_storage_ptr___00);
        }
        else {
          lVar3 = std::__cxx11::string::find((char)&line,0x3d);
          if (lVar3 == -1) {
            std::__cxx11::string::string(local_350,"inifile",(allocator *)&value);
            debug(&name);
            pDVar6 = DebugStream::operator<<
                               ((DebugStream *)&name,"invalid file, missing = at line ");
            DebugStream::operator<<(pDVar6,output);
            DebugStream::~DebugStream((DebugStream *)&name);
            psVar4 = local_350;
            goto LAB_00115e49;
          }
          std::__cxx11::string::substr((ulong)&local_3f8,(ulong)&line);
          std::__cxx11::string::string(local_2b8,"%20",(allocator *)&value);
          std::__cxx11::string::string(local_370," ",&local_441);
          while( true ) {
            psVar4 = (string *)std::__cxx11::string::find((string *)&local_3f8,(ulong)local_2b8);
            if (psVar4 == (string *)0xffffffffffffffff) break;
            std::__cxx11::string::erase((ulong)&local_3f8,(ulong)psVar4);
            std::__cxx11::string::insert((ulong)&local_3f8,psVar4);
          }
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          if (local_3f8 == &local_3e8) {
            local_3b0.field_2._8_8_ = local_3e8._8_8_;
          }
          else {
            local_3b0._M_dataplus._M_p = (pointer)local_3f8;
          }
          local_3b0.field_2._M_allocated_capacity._1_7_ = local_3e8._M_allocated_capacity._1_7_;
          local_3b0.field_2._M_local_buf[0] = local_3e8._M_local_buf[0];
          __return_storage_ptr__ = &name;
          local_3b0._M_string_length = local_3f0;
          local_3f0 = 0;
          local_3e8._M_local_buf[0] = '\0';
          local_3f8 = &local_3e8;
          trim(__return_storage_ptr__,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string(local_370);
          std::__cxx11::string::~string(local_2b8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
          trim(&value,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          bVar7 = std::operator==(__return_storage_ptr__,"");
          if (!bVar7) {
            bVar7 = std::operator==(&value,"");
            if (!bVar7) {
              this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[](local_3d8,&group);
              pmVar5 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](this_00,__return_storage_ptr__);
              std::__cxx11::string::_M_assign((string *)pmVar5);
            }
          }
          __return_storage_ptr___00 = &value;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::~string((string *)&group);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&file);
  return bVar7;
}

Assistant:

bool IniFile::readFile(std::string filename)
{
    std::ifstream file;
    wordexp_t exp_res;
    wordexp(filename.c_str(), &exp_res, 0);
    file.open(exp_res.we_wordv[0]);
    wordfree(&exp_res);

    if (!file.is_open()) {
        debug("inifile") << "unable to open file" << filename;
        return 1;
    }

    std::string line;
    std::string group;
    size_t linenum = 0;

    while (std::getline(file, line)) {
        linenum++;
        size_t commentStart = line.find("//");

        if (commentStart != std::string::npos) {
            line = trim(line.substr(0, commentStart));
        }

        if (line.length() == 0 || line.front() == '#') {
            continue;
        }

        if (line[0] == '[') {
            size_t end = line.find(']');

            if (end == std::string::npos) {
                debug("inifile") << "invalid file, unclosed group at line " << linenum;
                return false;
            }

            group = trim(line.substr(1, end - 1));
            continue;
        }

        size_t nameEnd = line.find('=');

        if (nameEnd == std::string::npos) {
            debug("inifile") << "invalid file, missing = at line " << linenum;
            return false;
        }

        std::string name = trim(string_replace(line.substr(0, nameEnd), "%20", " "));
        std::string value = trim(line.substr(nameEnd + 1));

        if (name == "" || value == "") {
            continue;
        }

        m_values[group][name] = value;
    }

    return true;
}